

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cigar.c
# Opt level: O1

char * parasail_cigar_decode(parasail_cigar_t *cigar)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  char *__dest;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char tmp [40];
  char acStack_58 [40];
  
  lVar6 = (long)cigar->len;
  __dest = (char *)malloc(lVar6 * 4 + 1);
  *__dest = '\0';
  if (0 < lVar6) {
    uVar7 = lVar6 << 2;
    lVar6 = 0;
    uVar5 = 0;
    do {
      uVar2 = cigar->seq[lVar6] & 0xf;
      uVar4 = 0x4d;
      if (uVar2 < 10) {
        uVar4 = (ulong)(uint)(int)"MIDNSHP=XB"[uVar2];
      }
      iVar3 = snprintf(acStack_58,0x28,"%u%c",(ulong)(cigar->seq[lVar6] >> 4),uVar4);
      if (iVar3 < 0x28) {
        uVar5 = uVar5 + (long)iVar3;
        if (uVar7 <= uVar5) {
          lVar1 = uVar7 * 2;
          uVar7 = uVar7 * 2;
          __dest = (char *)realloc(__dest,lVar1 + 1);
        }
        strcat(__dest,acStack_58);
      }
      else {
        parasail_cigar_decode_cold_1();
      }
      if (0x27 < iVar3) {
        return (char *)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < cigar->len);
  }
  return __dest;
}

Assistant:

char* parasail_cigar_decode(parasail_cigar_t *cigar)
{
#define SIZE 40
    char *ret = NULL;
    size_t retlen = 0;
    size_t size = 0;
    int i = 0;

    /* initial allocation for 1 op and 3 number characters per cigar int */
    size = sizeof(char)*cigar->len*4;
    ret = malloc(size+1);
    ret[0] = '\0';

    for (i=0; i<cigar->len; ++i) {
        char tmp[SIZE];
        char op = parasail_cigar_decode_op(cigar->seq[i]);
        uint32_t len = parasail_cigar_decode_len(cigar->seq[i]);
        int snprintf_retcode = snprintf(tmp, SIZE, "%u%c", len, op);
        if (snprintf_retcode >= SIZE) {
            fprintf(stderr, "invalid CIGAR\n");
            free(ret);
            return NULL;
        }
        retlen += snprintf_retcode;
        if (retlen >= size) {
            size *= 2;
            ret = realloc(ret, size+1);
        }
        strcat(ret, tmp);
    }

    return ret;
}